

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::FloatImageTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FloatImageTexture *this)

{
  MIPMap *args_1;
  
  args_1 = (this->super_ImageTextureBase).mipmap;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::TextureMapping2DHandle_const&,float_const&,pbrt::MIPMap&>
            (__return_storage_ptr__,"[ FloatImageTexture mapping: %s scale: %f mipmap: %s ]",
             (TextureMapping2DHandle *)this,&(this->super_ImageTextureBase).scale,args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatImageTexture::ToString() const {
    return StringPrintf("[ FloatImageTexture mapping: %s scale: %f mipmap: %s ]", mapping,
                        scale, *mipmap);
}